

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O1

void __thiscall btGeneric6DofConstraint::calculateLinearInfo(btGeneric6DofConstraint *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  btScalar test_value;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  int i;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  uVar7 = *(undefined8 *)(this->m_calculatedTransformB).m_origin.m_floats;
  uVar8 = *(undefined8 *)(this->m_calculatedTransformA).m_origin.m_floats;
  auVar9._4_4_ = (float)((ulong)uVar7 >> 0x20) - (float)((ulong)uVar8 >> 0x20);
  auVar9._0_4_ = (float)uVar7 - (float)uVar8;
  auVar9._8_4_ = (this->m_calculatedTransformB).m_origin.m_floats[2] -
                 (this->m_calculatedTransformA).m_origin.m_floats[2];
  auVar9._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_calculatedLinearDiff).m_floats = auVar9;
  fVar1 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
  fVar2 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
  fVar3 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
  uVar7 = *(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[1].m_floats + 1);
  uVar8 = *(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[2].m_floats + 1);
  fVar12 = (float)uVar7;
  fVar14 = (float)((ulong)uVar7 >> 0x20);
  fVar18 = (float)uVar8;
  fVar20 = (float)((ulong)uVar8 >> 0x20);
  uVar7 = *(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 1);
  fVar16 = (float)uVar7;
  fVar17 = (float)((ulong)uVar7 >> 0x20);
  fVar13 = fVar12 * fVar20 - fVar18 * fVar14;
  fVar15 = fVar14 * fVar1 - fVar20 * fVar2;
  fVar11 = fVar2 * fVar18 - fVar1 * fVar12;
  fVar19 = 1.0 / (fVar17 * fVar11 + fVar3 * fVar13 + fVar15 * fVar16);
  fVar4 = (this->m_calculatedLinearDiff).m_floats[1];
  fVar5 = (this->m_calculatedLinearDiff).m_floats[0];
  fVar6 = (this->m_calculatedLinearDiff).m_floats[2];
  *(ulong *)(this->m_calculatedLinearDiff).m_floats =
       CONCAT44(fVar6 * (fVar2 * fVar17 - fVar14 * fVar3) * fVar19 +
                fVar5 * fVar15 * fVar19 + fVar4 * (fVar3 * fVar20 + -fVar17 * fVar1) * fVar19,
                fVar6 * (fVar14 * fVar16 - fVar12 * fVar17) * fVar19 +
                fVar5 * fVar13 * fVar19 + fVar4 * (fVar17 * fVar18 + -fVar16 * fVar20) * fVar19);
  *(ulong *)((this->m_calculatedLinearDiff).m_floats + 2) =
       (ulong)(uint)((fVar1 * fVar16 + -fVar3 * fVar18) * fVar19 * fVar4 + fVar11 * fVar19 * fVar5 +
                    (fVar3 * fVar12 - fVar2 * fVar16) * fVar19 * fVar6);
  lVar10 = 0;
  do {
    test_value = (this->m_calculatedLinearDiff).m_floats[lVar10];
    (this->m_linearLimits).m_currentLinearDiff.m_floats[lVar10] = test_value;
    btTranslationalLimitMotor::testLimitValue(&this->m_linearLimits,(int)lVar10,test_value);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  return;
}

Assistant:

void btGeneric6DofConstraint::calculateLinearInfo()
{
	m_calculatedLinearDiff = m_calculatedTransformB.getOrigin() - m_calculatedTransformA.getOrigin();
	m_calculatedLinearDiff = m_calculatedTransformA.getBasis().inverse() * m_calculatedLinearDiff;
	for(int i = 0; i < 3; i++)
	{
		m_linearLimits.m_currentLinearDiff[i] = m_calculatedLinearDiff[i];
		m_linearLimits.testLimitValue(i, m_calculatedLinearDiff[i]);
	}
}